

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsCreators.cpp
# Opt level: O3

void chrono::utils::AddTorusGeometry
               (ChBody *body,shared_ptr<chrono::ChMaterialSurface> *material,double radius,
               double thickness,int segments,int angle,ChVector<double> *pos,
               ChQuaternion<double> *rot,bool visualization,
               shared_ptr<chrono::ChVisualMaterial> *vis_material)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  int iVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  ChVector<double> v;
  ChQuaternion<double> q;
  shared_ptr<chrono::ChVisualMaterial> local_e8;
  shared_ptr<chrono::ChMaterialSurface> local_d8;
  double local_c8;
  ChBody *local_c0;
  double local_b8;
  double local_b0;
  ChQuaternion<double> local_a8;
  double local_88;
  undefined8 uStack_80;
  ChQuaternion<double> local_78;
  ChQuaternion<double> local_50;
  
  if (0 < angle) {
    iVar5 = 0;
    local_c8 = (((radius + thickness) * 6.283185307179586) / (double)segments) * 0.5;
    local_c0 = body;
    do {
      local_88 = ((double)iVar5 * 3.141592653589793) / 180.0;
      uStack_80 = 0;
      local_b0 = cos(local_88);
      local_b8 = sin(local_88);
      Q_from_AngAxis(&local_a8,-local_88,(ChVector<double> *)&VECT_Y);
      Q_from_AngAxis(&local_78,1.5707963267948966,(ChVector<double> *)&VECT_X);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_a8.m_data[1];
      auVar4._8_8_ = local_78.m_data[1];
      auVar4._0_8_ = local_78.m_data[0];
      auVar4._16_8_ = local_78.m_data[2];
      auVar4._24_8_ = local_78.m_data[3];
      auVar8._24_8_ = local_a8.m_data[3];
      auVar8._16_8_ = local_a8.m_data[2];
      auVar13._24_8_ = local_78.m_data[1];
      auVar13._16_8_ = local_78.m_data[1];
      auVar9._0_8_ = -local_a8.m_data[1];
      auVar9._8_8_ = 0x8000000000000000;
      auVar2 = vpermpd_avx2(auVar4,1);
      auVar11._0_8_ = -local_a8.m_data[2];
      auVar11._8_8_ = -local_a8.m_data[3];
      auVar3 = vpermpd_avx2(ZEXT1632(CONCAT88(local_78.m_data[3],local_78.m_data[2])),0x15);
      auVar7 = vunpcklpd_avx(auVar9,auVar7);
      auVar10._16_16_ = auVar9;
      auVar10._0_16_ = auVar11;
      auVar8._0_16_ = auVar7;
      auVar6._0_8_ = auVar2._0_8_ * auVar7._0_8_;
      auVar6._8_8_ = auVar2._8_8_ * auVar7._8_8_;
      auVar6._16_8_ = auVar2._16_8_ * local_a8.m_data[2];
      auVar6._24_8_ = auVar2._24_8_ * local_a8.m_data[3];
      auVar2._8_8_ = local_a8.m_data[0];
      auVar2._0_8_ = local_a8.m_data[0];
      auVar2._16_8_ = local_a8.m_data[0];
      auVar2._24_8_ = local_a8.m_data[0];
      auVar6 = vfmadd231pd_avx512vl(auVar6,auVar4,auVar2);
      auVar12._24_8_ = local_a8.m_data[3];
      auVar12._16_8_ = local_a8.m_data[3];
      auVar13._8_8_ = local_78.m_data[2];
      auVar13._0_8_ = local_78.m_data[2];
      auVar2 = vpermpd_avx2(auVar8,0x66);
      auVar2 = vshufpd_avx(auVar10,auVar2,9);
      auVar12._0_16_ = auVar11;
      auVar4 = vpermpd_avx2(auVar12,0x24);
      auVar7 = vfmadd213pd_fma(auVar13,auVar4,auVar6);
      auVar7 = vfmadd213pd_fma(auVar2,auVar3,ZEXT1632(auVar7));
      local_50.m_data = (double  [4])ZEXT1632(auVar7);
      local_d8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
      local_d8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)
               ._M_refcount._M_pi;
      p_Var1 = (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)
               ._M_refcount._M_pi;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        }
      }
      local_a8.m_data[0] = radius * local_b0 + pos->m_data[0];
      local_a8.m_data[1] = pos->m_data[1] + 0.0;
      local_a8.m_data[2] = radius * local_b8 + pos->m_data[2];
      local_e8.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (vis_material->super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
      local_e8.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (vis_material->
              super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
              _M_pi;
      p_Var1 = (vis_material->
               super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
               ._M_pi;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        }
      }
      AddCapsuleGeometry(local_c0,&local_d8,thickness,local_c8,(ChVector<double> *)&local_a8,
                         &local_50,visualization,&local_e8);
      if (local_e8.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_e8.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_d8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_d8.
                   super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      iVar5 = iVar5 + angle / segments;
    } while (iVar5 < angle);
  }
  return;
}

Assistant:

void AddTorusGeometry(ChBody* body,
                      std::shared_ptr<ChMaterialSurface> material,
                      double radius,
                      double thickness,
                      int segments,
                      int angle,
                      const ChVector<>& pos,
                      const ChQuaternion<>& rot,
                      bool visualization,
                      std::shared_ptr<ChVisualMaterial> vis_material) {
    for (int i = 0; i < angle; i += angle / segments) {
        double alpha = i * CH_C_PI / 180.0;
        double x = cos(alpha) * radius;
        double z = sin(alpha) * radius;
        Quaternion q = chrono::Q_from_AngAxis(-alpha, VECT_Y) % chrono::Q_from_AngAxis(CH_C_PI / 2.0, VECT_X);
        double outer_circ = 2 * CH_C_PI * (radius + thickness);

        AddCapsuleGeometry(body, material, thickness, outer_circ / segments * .5, ChVector<>(x, 0, z) + pos, q,
                           visualization, vis_material);
    }
}